

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *window;
  ImGuiOldColumnData *pIVar3;
  undefined1 auVar4 [16];
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiID id;
  ImGuiOldColumns *pIVar7;
  ImGuiOldColumnData *pIVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int n;
  ulong uVar13;
  int iVar14;
  ImGuiContext *g;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 local_58;
  
  pIVar6 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe92,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  if ((window->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
    id = GetColumnsID(str_id,columns_count);
    pIVar7 = FindOrCreateColumns(window,id);
    if (pIVar7->ID != id) {
      __assert_fail("columns->ID == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0xe98,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
    }
    pIVar7->Current = 0;
    pIVar7->Count = columns_count;
    pIVar7->Flags = flags;
    (window->DC).CurrentColumns = pIVar7;
    pIVar7->HostCursorPosY = (window->DC).CursorPos.y;
    pIVar7->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
    IVar5 = (window->ClipRect).Max;
    (pIVar7->HostInitialClipRect).Min = (window->ClipRect).Min;
    (pIVar7->HostInitialClipRect).Max = IVar5;
    IVar5 = (window->ParentWorkRect).Max;
    (pIVar7->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
    (pIVar7->HostBackupParentWorkRect).Max = IVar5;
    IVar5 = (window->WorkRect).Max;
    (window->ParentWorkRect).Min = (window->WorkRect).Min;
    (window->ParentWorkRect).Max = IVar5;
    fVar18 = (window->WindowPadding).x;
    auVar20 = ZEXT416((uint)(fVar18 * 0.5));
    auVar4 = vcmpss_avx(ZEXT416((uint)window->WindowBorderSize),auVar20,2);
    auVar4 = vblendvps_avx(ZEXT416((uint)window->WindowBorderSize),auVar20,auVar4);
    fVar1 = (pIVar6->Style).ItemSpacing.x;
    auVar20._0_4_ = (int)auVar4._0_4_;
    auVar20._4_4_ = (int)auVar4._4_4_;
    auVar20._8_4_ = (int)auVar4._8_4_;
    auVar20._12_4_ = (int)auVar4._12_4_;
    auVar20 = vcvtdq2ps_avx(auVar20);
    fVar17 = (window->WorkRect).Max.x;
    auVar19 = ZEXT416((uint)(fVar1 - fVar18));
    auVar4 = vcmpss_avx(ZEXT816(0) << 0x40,auVar19,2);
    auVar4 = vandps_avx(auVar4,auVar19);
    auVar20 = vminss_avx(ZEXT416((uint)((fVar1 + fVar17) - auVar4._0_4_)),
                         ZEXT416((uint)(fVar17 + auVar20._0_4_)));
    fVar18 = auVar4._0_4_ + ((window->DC).Indent.x - fVar1);
    pIVar7->OffMinX = fVar18;
    auVar19 = ZEXT416((uint)(fVar18 + 1.0));
    auVar20 = ZEXT416((uint)(auVar20._0_4_ - (window->Pos).x));
    auVar4 = vcmpss_avx(auVar19,auVar20,2);
    auVar4 = vblendvps_avx(auVar19,auVar20,auVar4);
    pIVar7->OffMaxX = auVar4._0_4_;
    fVar18 = (window->DC).CursorPos.y;
    pIVar7->LineMaxY = fVar18;
    pIVar7->LineMinY = fVar18;
    uVar9 = (pIVar7->Columns).Size;
    uVar11 = columns_count + 1;
    if (uVar9 != uVar11 && uVar9 != 0) {
      iVar14 = (pIVar7->Columns).Capacity;
      if (iVar14 < 0) {
        uVar9 = iVar14 / 2 + iVar14;
        uVar13 = 0;
        if (0 < (int)uVar9) {
          uVar13 = (ulong)uVar9;
        }
        pIVar8 = (ImGuiOldColumnData *)MemAlloc(uVar13 * 0x1c);
        pIVar3 = (pIVar7->Columns).Data;
        if (pIVar3 != (ImGuiOldColumnData *)0x0) {
          memcpy(pIVar8,pIVar3,(long)(pIVar7->Columns).Size * 0x1c);
          MemFree((pIVar7->Columns).Data);
        }
        (pIVar7->Columns).Data = pIVar8;
        (pIVar7->Columns).Capacity = (int)uVar13;
      }
      (pIVar7->Columns).Size = 0;
    }
    bVar16 = (pIVar7->Columns).Size == 0;
    pIVar7->IsFirstFrame = bVar16;
    if (bVar16) {
      if ((pIVar7->Columns).Capacity <= columns_count) {
        pIVar8 = (ImGuiOldColumnData *)MemAlloc((ulong)uVar11 * 0x1c);
        pIVar3 = (pIVar7->Columns).Data;
        if (pIVar3 != (ImGuiOldColumnData *)0x0) {
          memcpy(pIVar8,pIVar3,(long)(pIVar7->Columns).Size * 0x1c);
          MemFree((pIVar7->Columns).Data);
        }
        (pIVar7->Columns).Data = pIVar8;
        (pIVar7->Columns).Capacity = uVar11;
      }
      uVar9 = 0;
      do {
        iVar14 = (pIVar7->Columns).Size;
        iVar2 = (pIVar7->Columns).Capacity;
        if (iVar14 == iVar2) {
          if (iVar2 == 0) {
            iVar10 = 8;
          }
          else {
            iVar10 = iVar2 / 2 + iVar2;
          }
          iVar14 = iVar14 + 1;
          if (iVar14 < iVar10) {
            iVar14 = iVar10;
          }
          if (iVar2 < iVar14) {
            pIVar8 = (ImGuiOldColumnData *)MemAlloc((long)iVar14 * 0x1c);
            pIVar3 = (pIVar7->Columns).Data;
            if (pIVar3 != (ImGuiOldColumnData *)0x0) {
              memcpy(pIVar8,pIVar3,(long)(pIVar7->Columns).Size * 0x1c);
              MemFree((pIVar7->Columns).Data);
            }
            (pIVar7->Columns).Data = pIVar8;
            (pIVar7->Columns).Capacity = iVar14;
          }
        }
        pIVar3 = (pIVar7->Columns).Data;
        iVar14 = (pIVar7->Columns).Size;
        pIVar3[iVar14].OffsetNorm = (float)(int)uVar9 / (float)columns_count;
        pIVar8 = pIVar3 + iVar14;
        pIVar8->OffsetNormBeforeResize = 0.0;
        pIVar8->Flags = 0;
        (((ImRect *)(&pIVar8->OffsetNormBeforeResize + 2))->Min).x = 0.0;
        (((ImRect *)(&pIVar8->OffsetNormBeforeResize + 2))->Min).y = 0.0;
        pIVar3[iVar14].ClipRect.Max.x = 0.0;
        pIVar3[iVar14].ClipRect.Max.y = 0.0;
        (pIVar7->Columns).Size = (pIVar7->Columns).Size + 1;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    uVar13 = 1;
    if (1 < columns_count) {
      uVar13 = (ulong)(uint)columns_count;
    }
    lVar12 = 0xc;
    uVar15 = 0;
    do {
      if ((long)(pIVar7->Columns).Size <= (long)uVar15) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,
                      "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
      }
      pIVar3 = (pIVar7->Columns).Data;
      fVar18 = (window->Pos).x;
      fVar17 = GetColumnOffset((int)uVar15);
      auVar4 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar17 + fVar18 + 0.5)));
      fVar18 = (window->Pos).x;
      uVar15 = uVar15 + 1;
      fVar17 = GetColumnOffset((int)uVar15);
      auVar20 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar17 + fVar18 + -1.0 + 0.5)));
      local_58 = auVar4._0_4_;
      *(undefined4 *)((long)&pIVar3->OffsetNorm + lVar12) = local_58;
      *(undefined4 *)((long)&pIVar3->OffsetNormBeforeResize + lVar12) = 0xff7fffff;
      *(int *)((long)&pIVar3->Flags + lVar12) = auVar20._0_4_;
      *(undefined4 *)((long)&(pIVar3->ClipRect).Min.x + lVar12) = 0x7f7fffff;
      ImRect::ClipWithFull((ImRect *)((long)&pIVar3->OffsetNorm + lVar12),&window->ClipRect);
      lVar12 = lVar12 + 0x1c;
    } while (uVar13 != uVar15);
    if (1 < pIVar7->Count) {
      ImDrawListSplitter::Split(&pIVar7->Splitter,window->DrawList,pIVar7->Count + 1);
      ImDrawListSplitter::SetCurrentChannel(&pIVar7->Splitter,window->DrawList,1);
      PushColumnClipRect(0);
    }
    fVar18 = GetColumnOffset(pIVar7->Current);
    fVar17 = GetColumnOffset(pIVar7->Current + 1);
    PushItemWidth((fVar17 - fVar18) * 0.65);
    auVar20 = ZEXT416((uint)(fVar1 - (window->WindowPadding).x));
    auVar4 = vcmpss_avx(ZEXT816(0) << 0x40,auVar20,2);
    auVar4 = vandps_avx(auVar4,auVar20);
    (window->DC).ColumnsOffset.x = auVar4._0_4_;
    fVar18 = (window->Pos).x;
    auVar4 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar4._0_4_ + fVar18 + (window->DC).Indent.x)));
    (window->DC).CursorPos.x = auVar4._0_4_;
    (window->WorkRect).Max.x = (fVar18 + fVar17) - fVar1;
    return;
  }
  __assert_fail("window->DC.CurrentColumns == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0xe93,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}